

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

bool __thiscall cmCPackDebGenerator::createDbgsymDDeb(cmCPackDebGenerator *this)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  mapped_type *pmVar5;
  string *psVar6;
  long *plVar7;
  cmValue cVar8;
  cmValue numThreads;
  cmValue debianArchiveType;
  size_type *psVar9;
  cmCPackLog *pcVar10;
  key_type local_458;
  key_type local_438;
  key_type local_418;
  string local_3f8;
  string local_3d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string packageNameLower;
  DebGenerator gen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar1 = &gen.OutputName._M_string_length;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_NAME","")
  ;
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  cmsys::SystemTools::LowerCase(&packageNameLower,psVar4);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&gen,packageNameLower._M_dataplus._M_p,
             packageNameLower._M_dataplus._M_p + packageNameLower._M_string_length);
  std::__cxx11::string::append((char *)&gen);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Package","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_458);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Package-Type","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x6e0bb1);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Version","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Auto-Built-Package","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x6e0bc3);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  psVar6 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3d8);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8," (= ","");
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  plVar7 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_3f8,0,(char *)0x0,(ulong)(psVar6->_M_dataplus)._M_p);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_438.field_2._M_allocated_capacity = *psVar9;
    local_438.field_2._8_8_ = plVar7[3];
  }
  else {
    local_438.field_2._M_allocated_capacity = *psVar9;
    local_438._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_438._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_438,(ulong)(psVar4->_M_dataplus)._M_p);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_458.field_2._M_allocated_capacity = *psVar9;
    local_458.field_2._8_8_ = plVar7[3];
  }
  else {
    local_458.field_2._M_allocated_capacity = *psVar9;
    local_458._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_458._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_458);
  pcVar10 = (cmCPackLog *)(plVar7 + 2);
  if ((cmCPackLog *)*plVar7 == pcVar10) {
    gen.OutputName._M_string_length._0_1_ = pcVar10->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar10->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar10->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar10->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar10->LastTag;
    gen.OutputName.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar7[3];
    gen.OutputName.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    gen.Logger = (cmCPackLog *)psVar1;
  }
  else {
    gen.OutputName._M_string_length._0_1_ = pcVar10->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar10->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar10->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar10->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar10->LastTag;
    gen.Logger = (cmCPackLog *)*plVar7;
  }
  gen.OutputName._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)pcVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Depends","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_418);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Section","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x6db134);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Priority","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x6e0be9);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Architecture","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_458);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Maintainer","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_458);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"debug symbols for ","");
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_458,(ulong)packageNameLower._M_dataplus._M_p);
  pcVar10 = (cmCPackLog *)(plVar7 + 2);
  if ((cmCPackLog *)*plVar7 == pcVar10) {
    gen.OutputName._M_string_length._0_1_ = pcVar10->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar10->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar10->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar10->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar10->LastTag;
    gen.OutputName.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar7[3];
    gen.OutputName.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    gen.Logger = (cmCPackLog *)psVar1;
  }
  else {
    gen.OutputName._M_string_length._0_1_ = pcVar10->Verbose;
    gen.OutputName._M_string_length._1_1_ = pcVar10->Debug;
    gen.OutputName._M_string_length._2_1_ = pcVar10->Quiet;
    gen.OutputName._M_string_length._3_1_ = pcVar10->NewLine;
    gen.OutputName._M_string_length._4_4_ = pcVar10->LastTag;
    gen.Logger = (cmCPackLog *)*plVar7;
  }
  gen.OutputName._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)pcVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Description","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_438);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE","");
  cVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Source","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"GEN_BUILD_IDS","");
  cVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Build-Ids","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  pcVar10 = (this->super_cmCPackGenerator).Logger;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_458,"GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME","");
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_458);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar2,pcVar2 + psVar4->_M_string_length);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"GEN_DBGSYMDIR","");
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_438);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + psVar4->_M_string_length);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"CPACK_TOPLEVEL_DIRECTORY","");
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3d8);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar2,pcVar2 + psVar4->_M_string_length);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,"CPACK_TEMPORARY_DIRECTORY","");
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3f8);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar2,pcVar2 + psVar4->_M_string_length);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  cVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_418);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"CPACK_THREADS","");
  numThreads = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2e8);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE","");
  debianArchiveType = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_308);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION","");
  bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,&this->packageFiles);
  anon_unknown.dwarf_1e1bc4::DebGenerator::DebGenerator
            (&gen,pcVar10,&local_268,&local_288,&local_2a8,&local_2c8,cVar8,numThreads,
             debianArchiveType,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,false,&local_328,false,&local_348,false,&local_368,(cmValue)0x0,bVar3,
             &local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  bVar3 = anon_unknown.dwarf_1e1bc4::DebGenerator::generate(&gen);
  anon_unknown.dwarf_1e1bc4::DebGenerator::~DebGenerator(&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageNameLower._M_dataplus._M_p != &packageNameLower.field_2) {
    operator_delete(packageNameLower._M_dataplus._M_p,
                    packageNameLower.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return bVar3;
}

Assistant:

bool cmCPackDebGenerator::createDbgsymDDeb()
{
  // Packages containing debug symbols follow the same structure as .debs
  // but have different metadata and content.

  std::map<std::string, std::string> controlValues;
  // debian policy enforce lower case for package name
  std::string packageNameLower = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  cmValue debian_pkg_version =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");

  controlValues["Package"] = packageNameLower + "-dbgsym";
  controlValues["Package-Type"] = "ddeb";
  controlValues["Version"] = *debian_pkg_version;
  controlValues["Auto-Built-Package"] = "debug-symbols";
  controlValues["Depends"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") + std::string(" (= ") +
    *debian_pkg_version + ")";
  controlValues["Section"] = "debug";
  controlValues["Priority"] = "optional";
  controlValues["Architecture"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    std::string("debug symbols for ") + packageNameLower;

  cmValue debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (cmNonempty(debian_pkg_source)) {
    controlValues["Source"] = *debian_pkg_source;
  }
  cmValue debian_build_ids = this->GetOption("GEN_BUILD_IDS");
  if (cmNonempty(debian_build_ids)) {
    controlValues["Build-Ids"] = *debian_build_ids;
  }

  DebGenerator gen(
    this->Logger, this->GetOption("GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME"),
    this->GetOption("GEN_DBGSYMDIR"),
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("CPACK_THREADS"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, false, "",
    false, "", false, "", nullptr,
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    this->packageFiles);

  return gen.generate();
}